

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O2

void __thiscall GdlSetAttrItem::GdlSetAttrItem(GdlSetAttrItem *this,GdlSetAttrItem *rit)

{
  pointer ppGVar1;
  GdlAttrValueSpec *this_00;
  ulong uVar2;
  GdlAttrValueSpec *local_38;
  
  GdlRuleItem::GdlRuleItem(&this->super_GdlRuleItem,&rit->super_GdlRuleItem);
  (this->super_GdlRuleItem)._vptr_GdlRuleItem = (_func_int **)&PTR_Clone_00213518;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_nAttachTo = -1;
  for (uVar2 = 0;
      ppGVar1 = (rit->m_vpavs).
                super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(rit->m_vpavs).
                            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this_00 = (GdlAttrValueSpec *)operator_new(0x48);
    GdlAttrValueSpec::GdlAttrValueSpec(this_00,ppGVar1[uVar2]);
    local_38 = this_00;
    std::vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>>::
    emplace_back<GdlAttrValueSpec*>
              ((vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>> *)&this->m_vpavs,
               &local_38);
  }
  return;
}

Assistant:

GdlSetAttrItem(const GdlSetAttrItem & rit)
		:	GdlRuleItem(rit)
	{
		m_nAttachTo = -1;
		Assert(m_vpavs.size() == 0);
		for (size_t i = 0; i < rit.m_vpavs.size(); ++i)
			m_vpavs.push_back(new GdlAttrValueSpec(*rit.m_vpavs[i]));
	}